

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall Liby::Socket::createSocket(Socket *this)

{
  int iVar1;
  undefined1 extraout_DL;
  uint __type;
  undefined1 *puVar3;
  __shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2> local_20;
  __shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  __type = this->isUdp_ + 1;
  p_Var2 = (__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2> *)(ulong)__type;
  puVar3 = (undefined1 *)0x2;
  iVar1 = socket(2,__type,0);
  this->fd_ = iVar1;
  if (-1 < iVar1) {
    std::make_shared<Liby::FileDescriptor,int&>((int *)&local_20);
    std::__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>,
               &local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    return;
  }
  throw_err();
  *puVar3 = extraout_DL;
  *(int *)(puVar3 + 4) = p_Var2->_M_ptr->fd_;
  std::__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2> *)(puVar3 + 8),p_Var2);
  *(undefined2 *)(puVar3 + 0x18) = 0;
  *(undefined4 *)(puVar3 + 0x1c) = 0;
  return;
}

Assistant:

void Socket::createSocket() {
    fd_ = ::socket(AF_INET, isUdp_ ? SOCK_DGRAM : SOCK_STREAM, 0);
    if (fd_ < 0) {
        throw_err();
    }

    fp_ = std::make_shared<FileDescriptor>(fd_);
}